

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int trico_read_vec2_double(void *a,double **uv,trico_stream_type st)

{
  trico_stream_type tVar1;
  ssize_t sVar2;
  uint32_t local_5c;
  double *pdStack_58;
  uint32_t nr_of_doubles_v;
  double *decompressed_v;
  double *pdStack_48;
  uint32_t nr_of_doubles_u;
  double *decompressed_u;
  void *compressed;
  uint32_t nr_of_compressed_bytes;
  uint32_t nr_uv_positions;
  trico_archive *arch;
  double **ppdStack_20;
  trico_stream_type st_local;
  double **uv_local;
  void *a_local;
  
  _nr_of_compressed_bytes = (trico_archive *)a;
  arch._4_4_ = st;
  ppdStack_20 = uv;
  uv_local = (double **)a;
  tVar1 = trico_get_next_stream_type(a);
  if (tVar1 == arch._4_4_) {
    sVar2 = read((int)&compressed + 4,(void *)0x4,1);
    if ((int)sVar2 == 0) {
      a_local._4_4_ = 0;
    }
    else {
      sVar2 = read((int)&compressed,(void *)0x4,1);
      if ((int)sVar2 == 0) {
        a_local._4_4_ = 0;
      }
      else {
        decompressed_u = (double *)trico_malloc((ulong)(uint)compressed);
        sVar2 = read((int)decompressed_u,(void *)0x1,(ulong)(uint)compressed);
        if ((int)sVar2 == 0) {
          a_local._4_4_ = 0;
        }
        else {
          trico_decompress_double_precision
                    ((uint32_t *)((long)&decompressed_v + 4),&stack0xffffffffffffffb8,
                     (uint8_t *)decompressed_u);
          sVar2 = read((int)&compressed,(void *)0x4,1);
          if ((int)sVar2 == 0) {
            a_local._4_4_ = 0;
          }
          else {
            decompressed_u = (double *)trico_realloc(decompressed_u,(ulong)(uint)compressed);
            sVar2 = read((int)decompressed_u,(void *)0x1,(ulong)(uint)compressed);
            if ((int)sVar2 == 0) {
              a_local._4_4_ = 0;
            }
            else {
              trico_decompress_double_precision
                        (&local_5c,&stack0xffffffffffffffa8,(uint8_t *)decompressed_u);
              trico_free(decompressed_u);
              if (decompressed_v._4_4_ != compressed._4_4_) {
                __assert_fail("nr_of_doubles_u == nr_uv_positions",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x535,
                              "int trico_read_vec2_double(void *, double **, enum trico_stream_type)"
                             );
              }
              if (local_5c != decompressed_v._4_4_) {
                __assert_fail("nr_of_doubles_v == nr_of_doubles_u",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                              ,0x536,
                              "int trico_read_vec2_double(void *, double **, enum trico_stream_type)"
                             );
              }
              if (ppdStack_20 != (double **)0x0) {
                trico_transpose_uv_soa_to_aos_double_precision
                          (ppdStack_20,pdStack_48,pdStack_58,compressed._4_4_);
              }
              trico_free(pdStack_48);
              trico_free(pdStack_58);
              read_next_stream_type(_nr_of_compressed_bytes);
              a_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int trico_read_vec2_double(void* a, double** uv, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != st)
    return 0;

  uint32_t nr_uv_positions;
  if (!read(&nr_uv_positions, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_u;
  uint32_t nr_of_doubles_u;
  trico_decompress_double_precision(&nr_of_doubles_u, &decompressed_u, (const uint8_t*)compressed);

  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  compressed = trico_realloc(compressed, nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  double* decompressed_v;
  uint32_t nr_of_doubles_v;
  trico_decompress_double_precision(&nr_of_doubles_v, &decompressed_v, (const uint8_t*)compressed);

  trico_free(compressed);

  assert(nr_of_doubles_u == nr_uv_positions);
  assert(nr_of_doubles_v == nr_of_doubles_u);

  if (uv != NULL)
    trico_transpose_uv_soa_to_aos_double_precision(uv, decompressed_u, decompressed_v, nr_uv_positions);

  trico_free(decompressed_u);
  trico_free(decompressed_v);

  read_next_stream_type(arch);

  return 1;
  }